

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caxpy.c
# Opt level: O1

void caxpy_(integer *n,singlecomplex *ca,singlecomplex *cx,integer *incx,singlecomplex *cy,
           integer *incy)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  long lVar9;
  float *pfVar10;
  long lVar11;
  float *pfVar12;
  uint uVar13;
  uint uVar14;
  float fVar15;
  double dVar16;
  
  if (0 < *n) {
    fVar1 = ca->r;
    uVar13 = -(uint)(-fVar1 <= fVar1);
    dVar16 = r_imag(ca);
    fVar15 = (float)dVar16;
    uVar14 = -(uint)(-fVar15 <= fVar15);
    fVar1 = (float)(uVar14 & (uint)fVar15 | ~uVar14 & (uint)-fVar15) +
            (float)(uVar13 & (uint)fVar1 | ~uVar13 & (uint)-fVar1);
    if ((fVar1 != 0.0) || (NAN(fVar1))) {
      iVar5 = *incx;
      if (((long)iVar5 == 1) && (*incy == 1)) {
        uVar13 = *n;
        if (0 < (int)uVar13) {
          uVar7 = 0;
          do {
            fVar1 = ca->r;
            fVar15 = ca->i;
            fVar2 = cx[uVar7].r;
            fVar3 = cx[uVar7].i;
            cy[uVar7].r = (fVar1 * fVar2 - fVar3 * fVar15) + cy[uVar7].r;
            cy[uVar7].i = fVar1 * fVar3 + fVar2 * fVar15 + cy[uVar7].i;
            uVar7 = uVar7 + 1;
          } while (uVar13 != uVar7);
        }
      }
      else {
        lVar11 = 1;
        lVar9 = 1;
        if (iVar5 < 0) {
          lVar9 = (long)((1 - *n) * iVar5 + 1);
        }
        iVar6 = *incy;
        if ((long)iVar6 < 0) {
          lVar11 = (long)((1 - *n) * iVar6 + 1);
        }
        iVar8 = *n;
        if (0 < iVar8) {
          pfVar10 = &cx[lVar9 + -1].i;
          pfVar12 = &cy[lVar11 + -1].i;
          do {
            fVar1 = ca->r;
            fVar15 = ca->i;
            fVar2 = ((singlecomplex *)(pfVar10 + -1))->r;
            fVar3 = *pfVar10;
            fVar4 = *pfVar12;
            ((singlecomplex *)(pfVar12 + -1))->r =
                 (fVar1 * fVar2 - fVar3 * fVar15) + ((singlecomplex *)(pfVar12 + -1))->r;
            *pfVar12 = fVar1 * fVar3 + fVar2 * fVar15 + fVar4;
            pfVar10 = pfVar10 + (long)iVar5 * 2;
            pfVar12 = pfVar12 + (long)iVar6 * 2;
            iVar8 = iVar8 + -1;
          } while (iVar8 != 0);
        }
      }
    }
  }
  return;
}

Assistant:

void caxpy_(integer *n, singlecomplex *ca, singlecomplex *cx, integer *
	incx, singlecomplex *cy, integer *incy)
{


    /* System generated locals */

    real r__1, r__2;
    singlecomplex q__1, q__2;

    /* Builtin functions */
    double r_imag(singlecomplex *);

    /* Local variables */
    integer i, ix, iy;


/*     constant times a vector plus a vector.   
       jack dongarra, linpack, 3/11/78.   
       modified 12/3/93, array(1) declarations changed to array(*)   


    
   Parameter adjustments   
       Function Body */
#define CY(I) cy[(I)-1]
#define CX(I) cx[(I)-1]


    if (*n <= 0) {
	return;
    }
    if ((r__1 = ca->r, dabs(r__1)) + (r__2 = r_imag(ca), dabs(r__2)) == 0.f) {
	return;
    }
    if (*incx == 1 && *incy == 1) {
	goto L20;
    }

/*        code for unequal increments or equal increments   
            not equal to 1 */

    ix = 1;
    iy = 1;
    if (*incx < 0) {
	ix = (-(*n) + 1) * *incx + 1;
    }
    if (*incy < 0) {
	iy = (-(*n) + 1) * *incy + 1;
    }
    for (i = 1; i <= *n; ++i) {
	q__2.r = ca->r * CX(ix).r - ca->i * CX(ix).i, q__2.i = ca->r * CX(
		ix).i + ca->i * CX(ix).r;
	q__1.r = CY(iy).r + q__2.r, q__1.i = CY(iy).i + q__2.i;
	CY(iy).r = q__1.r, CY(iy).i = q__1.i;
	ix += *incx;
	iy += *incy;
/* L10: */
    }
    return;

/*        code for both increments equal to 1 */

L20:
    for (i = 1; i <= *n; ++i) {
	q__2.r = ca->r * CX(i).r - ca->i * CX(i).i, q__2.i = ca->r * CX(
		i).i + ca->i * CX(i).r;
	q__1.r = CY(i).r + q__2.r, q__1.i = CY(i).i + q__2.i;
	CY(i).r = q__1.r, CY(i).i = q__1.i;
/* L30: */
    }
    return;
}